

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.c
# Opt level: O2

void print_exponential_number
               (output_gadget_t *output,floating_point_t number,printf_size_t precision,
               printf_size_t width,printf_flags_t flags,char *buf,printf_size_t len)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  floating_point_components number_;
  output_gadget_t *gadget;
  byte bVar4;
  printf_size_t width_00;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  printf_size_t pVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  double dVar15;
  double dVar16;
  floating_point_t number_00;
  ulong in_XMM0_Qb;
  floating_point_t in_XMM1_Qa;
  floating_point_t fVar17;
  floating_point_components local_80;
  floating_point_t local_68;
  char *local_58;
  output_gadget_t *local_50;
  floating_point_t local_48;
  ulong uStack_40;
  
  fVar17 = ABS(number);
  if ((number != 0.0) || (NAN(number))) {
    dVar15 = (double)((ulong)number & 0xfffffffffffff | 0x3ff0000000000000) + -1.5;
    dVar15 = (double)(int)((uint)((ulong)fVar17 >> 0x34) - 0x3ff) * 0.3010299956639812 +
             dVar15 * dVar15 * dVar15 * 0.042893282163284134 +
             dVar15 * dVar15 * -0.09650988486738929 +
             dVar15 * 0.2895296546021679 + 0.17609125905568124;
    iVar11 = (int)dVar15 - (uint)(dVar15 < 0.0 && (double)(int)dVar15 != dVar15);
    if (iVar11 == -0x134) {
      in_XMM1_Qa = 1e-308;
    }
    else {
      dVar15 = (double)iVar11 * 3.321928094887362 + 0.5;
      uVar6 = (int)dVar15 - (uint)((double)(int)dVar15 != dVar15 && dVar15 < 0.0);
      dVar15 = (double)iVar11 * 2.302585092994046 + (double)(int)uVar6 * -0.6931471805599453;
      dVar16 = dVar15 * dVar15;
      in_XMM1_Qa = (double)(((ulong)uVar6 << 0x34) + 0x3ff0000000000000) *
                   ((dVar15 + dVar15) /
                    (dVar16 / (dVar16 / (dVar16 / 14.0 + 10.0) + 6.0) + (2.0 - dVar15)) + 1.0);
    }
    bVar3 = fVar17 < in_XMM1_Qa;
    if (fVar17 < in_XMM1_Qa) {
      in_XMM1_Qa = in_XMM1_Qa / 10.0;
    }
    uVar12 = iVar11 - (uint)bVar3;
    uVar6 = -uVar12;
    if (0 < (int)uVar12) {
      uVar6 = uVar12;
    }
    if (uVar6 < 0x11) {
      in_XMM1_Qa = powers_of_10[uVar6];
      pVar9 = 1;
    }
    else {
      pVar9 = 0;
    }
  }
  else {
    uVar12 = 0;
    pVar9 = width;
  }
  uVar6 = flags & 0x1000;
  uVar14 = precision - 1;
  if (precision == 0) {
    uVar14 = 0;
  }
  if (uVar6 != 0) {
    precision = uVar14;
  }
  dVar15 = number;
  dVar16 = fVar17;
  local_68 = number;
  local_58 = buf;
  local_50 = output;
  if (uVar12 != 0) {
    bVar4 = (byte)pVar9 & (int)uVar12 < 0;
    if (bVar4 == 0) {
      dVar15 = fVar17 / in_XMM1_Qa;
    }
    else {
      dVar15 = fVar17 * in_XMM1_Qa;
    }
    dVar16 = dVar15;
    if ((int)(precision - uVar12) < 0x133) {
      dVar16 = (double)(long)dVar15;
      if (bVar4 == 0) {
        dVar16 = dVar16 * in_XMM1_Qa;
      }
      else {
        dVar16 = dVar16 / in_XMM1_Qa;
      }
      dVar16 = fVar17 - dVar16;
      dVar1 = powers_of_10[precision];
      if (bVar4 == 0) {
        uVar13 = ((uint)((ulong)in_XMM1_Qa >> 0x34) & 0x7ff) - 0x3ff;
        uVar8 = ((uint)((ulong)dVar1 >> 0x34) & 0x7ff) - 0x3ff;
        uVar7 = -uVar13;
        if (0 < (int)uVar13) {
          uVar7 = uVar13;
        }
        uVar13 = -uVar8;
        if (0 < (int)uVar8) {
          uVar13 = uVar8;
        }
        if (uVar13 < uVar7) {
          dVar16 = dVar16 / (in_XMM1_Qa / dVar1);
        }
        else {
          dVar16 = dVar16 * (dVar1 / in_XMM1_Qa);
        }
      }
      else {
        dVar16 = dVar16 * in_XMM1_Qa * dVar1;
      }
      dVar2 = dVar16 - (double)(long)dVar16;
      uVar5 = ((long)dVar16 + 1) - (ulong)(dVar2 < 0.5);
      uVar10 = uVar5 & 0xfffffffffffffffe;
      if (dVar2 != 0.5) {
        uVar10 = uVar5;
      }
      if (NAN(dVar2)) {
        uVar10 = uVar5;
      }
      local_80.integral = ((long)dVar15 + 1) - (ulong)((double)(long)uVar10 < dVar1);
      local_80.fractional = 0;
      if ((double)(long)uVar10 < dVar1) {
        local_80.fractional = uVar10;
      }
      local_80.is_negative = SUB81((ulong)number >> 0x3f,0);
      goto LAB_00103745;
    }
  }
  if ((long)number < 0) {
    dVar15 = -dVar16;
  }
  local_48 = fVar17;
  uStack_40 = in_XMM0_Qb & 0x7fffffffffffffff;
  get_components(&local_80,dVar15,precision);
  fVar17 = local_48;
LAB_00103745:
  uVar7 = uVar12;
  if (9 < local_80.integral) {
    uVar7 = uVar12 + 1;
    local_80.integral = 1;
    local_80.fractional = 0;
  }
  if (((int)uVar7 < -4 || uVar6 == 0) || (int)precision < (int)uVar7) {
    uVar12 = -uVar7;
    if (0 < (int)uVar7) {
      uVar12 = uVar7;
    }
    uVar13 = 5 - (uVar12 < 100);
    uVar14 = precision;
    uVar12 = uVar7;
  }
  else {
    uVar13 = 0;
    pVar9 = uVar14 - uVar7;
    if (uVar14 - uVar7 == 0 || (int)uVar14 < (int)uVar7) {
      pVar9 = 0;
    }
    number_00 = local_68;
    if ((long)number < 0) {
      number_00 = -fVar17;
    }
    get_components(&local_80,number_00,pVar9);
    uVar14 = pVar9;
    if (-2 < (int)uVar12) {
      uVar8 = uVar12 + 1;
      if ((powers_of_10[uVar8] == (double)local_80.integral) &&
         (!NAN(powers_of_10[uVar8]) && !NAN((double)local_80.integral))) {
        uVar13 = 0;
        uVar14 = pVar9 - 1;
        uVar12 = uVar8;
        if (pVar9 == 0) {
          uVar14 = uVar13;
        }
      }
    }
  }
  gadget = local_50;
  local_68 = (floating_point_t)CONCAT44(local_68._4_4_,uVar13);
  pVar9 = width - uVar13;
  if (width < uVar13) {
    pVar9 = 0;
  }
  width_00 = 0;
  if (uVar13 == 0) {
    width_00 = pVar9;
  }
  if ((flags & 2) == 0) {
    width_00 = pVar9;
  }
  pVar9 = local_50->pos;
  number_._17_7_ = local_80._17_7_;
  number_.is_negative = local_80.is_negative;
  number_.fractional = local_80.fractional;
  number_.integral = local_80.integral;
  print_broken_up_decimal(number_,local_50,uVar14,width_00,uVar6 >> 1 | flags,local_58,len);
  if (((int)uVar7 < -4 || uVar6 == 0) || (int)precision < (int)uVar7) {
    putchar_via_gadget(gadget,(byte)flags & 0x20 ^ 0x65);
    uVar6 = -uVar12;
    if (0 < (int)uVar12) {
      uVar6 = uVar12;
    }
    print_integer(gadget,(ulong)uVar6,SUB41(uVar12 >> 0x1f,0),'\n',0,local_68._0_4_ - 1,5);
    if ((flags & 2) != 0) {
      while (gadget->pos - pVar9 < width) {
        putchar_via_gadget(gadget,' ');
      }
    }
  }
  return;
}

Assistant:

static void print_exponential_number(output_gadget_t* output, floating_point_t number, printf_size_t precision, printf_size_t width, printf_flags_t flags, char* buf, printf_size_t len)
{
  const bool negative = get_sign_bit(number);
  // This number will decrease gradually (by factors of 10) as we "extract" the exponent out of it
  floating_point_t abs_number =  SIGN(negative, number);

  int floored_exp10;
  bool abs_exp10_covered_by_powers_table;
  struct scaling_factor normalization;


  // Determine the decimal exponent
  if (abs_number == (floating_point_t) 0.0) {
    // TODO: This is a special-case for 0.0 (and -0.0); but proper handling is required for denormals more generally.
    floored_exp10 = 0; // ... and no need to set a normalization factor or check the powers table
  }
  else  {
    floating_point_t exp10 = log10_of_positive(abs_number);
    floored_exp10 = bastardized_floor(exp10);
    floating_point_t p10 = pow10_of_int(floored_exp10);
    // correct for rounding errors
    if (abs_number < p10) {
      floored_exp10--;
      p10 /= 10;
    }
    abs_exp10_covered_by_powers_table = PRINTF_ABS(floored_exp10) < PRINTF_MAX_PRECOMPUTED_POWER_OF_10;
    normalization.raw_factor = abs_exp10_covered_by_powers_table ? powers_of_10[PRINTF_ABS(floored_exp10)] : p10;
  }

  if (flags & FLAGS_ADAPT_EXP) {
    // Note: For now, still assuming we _don't_ fall-back to "%f" mode; we can't decide
    // that until we've established the exact exponent.

    // In "%g" mode, "precision" is the number of _significant digits_; we must
    // "translate" that  to an actual number of decimal digits.
    precision = (precision > 1) ? (precision - 1U) : 0U;
    flags |= FLAGS_PRECISION;   // make sure print_broken_up_decimal respects our choice
  }

  // We now begin accounting for the widths of the two parts of our printed field:
  // the decimal part after decimal exponent extraction, and the base-10 exponent part.
  // For both of these, the value of 0 has a special meaning, but not the same one:
  // a 0 exponent-part width means "don't print the exponent"; a 0 decimal-part width
  // means "use as many characters as necessary".

  normalization.multiply = (floored_exp10 < 0 && abs_exp10_covered_by_powers_table);
  struct floating_point_components decimal_part_components =
    (floored_exp10 == 0) ?
    get_components(SIGN(negative, abs_number), precision) :
    get_normalized_components(negative, precision, abs_number, normalization, floored_exp10);

  // Account for roll-over, e.g. rounding from 9.99 to 100.0 - which effects
  // the exponent and may require additional tweaking of the parts
  // (and saving the floored_exp10 in case we'll need to undo the roll-over).
  int original_floored_exp10 = floored_exp10;
  if (decimal_part_components.integral >= 10) {
    floored_exp10++;
    decimal_part_components.integral = 1;
    decimal_part_components.fractional = 0;
  }

  // Should we want to fall-back to "%f" mode, and only print the decimal part?
  // (and remember we have decreased "precision" by 1
  bool fall_back_to_decimal_only_mode = (flags & FLAGS_ADAPT_EXP) && (floored_exp10 >= -4) && (floored_exp10 < (int) precision + 1);

  if (fall_back_to_decimal_only_mode) {
      precision = ((int) precision > floored_exp10) ? (unsigned) ((int) precision - floored_exp10) : 0U;
    // Redo some work :-)
    floored_exp10 = original_floored_exp10;
    decimal_part_components = get_components(SIGN(negative, abs_number), precision);

    if ((flags & FLAGS_ADAPT_EXP) && floored_exp10 >= -1 && ((double)decimal_part_components.integral == powers_of_10[floored_exp10 + 1])) {
      floored_exp10++; // Not strictly necessary, since floored_exp10 is no longer really used
      if (precision > 0U) { precision--; }
      // ... and it should already be the case that decimal_part_components.fractional == 0
    }
    // TODO: What about rollover strictly within the fractional part?
  }

  // the floored_exp10 format is "E%+03d" and largest possible floored_exp10 value for a 64-bit double
  // is "307" (for 2^1023), so we set aside 4-5 characters overall
  printf_size_t exp10_part_width = fall_back_to_decimal_only_mode ? 0U : (PRINTF_ABS(floored_exp10) < 100) ? 4U : 5U;

  printf_size_t decimal_part_width =
    ((flags & FLAGS_LEFT) && exp10_part_width) ?
      // We're padding on the right, so the width constraint is the exponent part's
      // problem, not the decimal part's, so we'll use as many characters as we need:
      0U :
      // We're padding on the left; so the width constraint is the decimal part's
      // problem. Well, can both the decimal part and the exponent part fit within our overall width?
      ((width > exp10_part_width) ?
        // Yes, so we limit our decimal part's width.
        // (Note this is trivially valid even if we've fallen back to "%f" mode)
        width - exp10_part_width :
        // No; we just give up on any restriction on the decimal part and use as many
        // characters as we need
        0U);

  const printf_size_t printed_exponential_start_pos = output->pos;
  print_broken_up_decimal(decimal_part_components, output, precision, decimal_part_width, flags, buf, len);

  if (! fall_back_to_decimal_only_mode) {
    putchar_via_gadget(output, (flags & FLAGS_UPPERCASE) ? 'E' : 'e');
    print_integer(output,
                  ABS_FOR_PRINTING(floored_exp10),
                  floored_exp10 < 0, 10, 0, exp10_part_width - 1,
                FLAGS_ZEROPAD | FLAGS_PLUS);
    if (flags & FLAGS_LEFT) {
      // We need to right-pad with spaces to meet the width requirement
      while (output->pos - printed_exponential_start_pos < width) {
        putchar_via_gadget(output, ' ');
      }
    }
  }
}